

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O1

aiMatrix4x4 * __thiscall Assimp::Ogre::TransformKeyFrame::Transform(TransformKeyFrame *this)

{
  float fVar1;
  float fVar2;
  aiMatrix4x4 *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar1 = (this->rotation).y;
  fVar3 = (this->rotation).z;
  fVar11 = (this->rotation).x;
  fVar6 = fVar1 * fVar1 + fVar3 * fVar3;
  fVar2 = (this->rotation).w;
  fVar7 = fVar11 * fVar1 - fVar3 * fVar2;
  fVar8 = fVar11 * fVar3 + fVar1 * fVar2;
  fVar5 = fVar3 * fVar2 + fVar11 * fVar1;
  fVar9 = fVar3 * fVar3 + fVar11 * fVar11;
  fVar10 = fVar1 * fVar3 - fVar11 * fVar2;
  fVar4 = fVar11 * fVar3 - fVar1 * fVar2;
  fVar3 = fVar11 * fVar2 + fVar1 * fVar3;
  fVar11 = fVar11 * fVar11 + fVar1 * fVar1;
  fVar1 = (this->scale).x;
  in_RDI->a1 = (1.0 - (fVar6 + fVar6)) * fVar1;
  in_RDI->a2 = (fVar7 + fVar7) * fVar1;
  in_RDI->a3 = (fVar8 + fVar8) * fVar1;
  in_RDI->a4 = (this->position).x;
  fVar1 = (this->scale).y;
  in_RDI->b1 = (fVar5 + fVar5) * fVar1;
  in_RDI->b2 = (1.0 - (fVar9 + fVar9)) * fVar1;
  in_RDI->b3 = (fVar10 + fVar10) * fVar1;
  in_RDI->b4 = (this->position).y;
  fVar1 = (this->scale).z;
  in_RDI->c1 = (fVar4 + fVar4) * fVar1;
  in_RDI->c2 = (fVar3 + fVar3) * fVar1;
  in_RDI->c3 = (1.0 - (fVar11 + fVar11)) * fVar1;
  in_RDI->c4 = (this->position).z;
  in_RDI->d1 = 0.0;
  in_RDI->d2 = 0.0;
  in_RDI->d3 = 0.0;
  in_RDI->d4 = 1.0;
  return in_RDI;
}

Assistant:

aiMatrix4x4 TransformKeyFrame::Transform()
{
    return aiMatrix4x4(scale, rotation, position);
}